

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

bool __thiscall
chaiscript::detail::Dispatch_Function::operator==(Dispatch_Function *this,Proxy_Function_Base *rhs)

{
  pointer psVar1;
  long lVar2;
  pointer psVar3;
  long *plVar4;
  
  lVar2 = __dynamic_cast(rhs,&chaiscript::dispatch::Proxy_Function_Base::typeinfo,&typeinfo,0);
  if (lVar2 == 0) {
    __cxa_bad_cast();
  }
  psVar3 = (this->m_funcs).
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_funcs).
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  plVar4 = *(long **)(lVar2 + 0x28);
  if ((long)psVar1 - (long)psVar3 == *(long *)(lVar2 + 0x30) - (long)plVar4) {
    if (psVar3 == psVar1) {
      return psVar3 == psVar1;
    }
    if ((psVar3->
        super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == (element_type *)*plVar4) {
      do {
        plVar4 = plVar4 + 2;
        psVar3 = psVar3 + 1;
        if (psVar3 == psVar1) {
          return psVar3 == psVar1;
        }
      } while ((psVar3->
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr == (element_type *)*plVar4);
    }
  }
  return false;
}

Assistant:

virtual bool operator==(const dispatch::Proxy_Function_Base &rhs) const CHAISCRIPT_OVERRIDE
        {
          try {
            const auto &dispatch_fun = dynamic_cast<const Dispatch_Function &>(rhs);
            return m_funcs == dispatch_fun.m_funcs;
          } catch (const std::bad_cast &) {
            return false;
          }
        }